

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Copysign_f32(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  float fVar2;
  Value *pVVar3;
  float fVar4;
  
  this_00 = &this->super_w3Stack;
  pVVar3 = w3Stack::value(this_00,Tag_f32);
  fVar2 = pVVar3->f32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  pVVar3 = w3Stack::value(this_00,Tag_f32);
  fVar4 = pVVar3->f32;
  if (0.0 <= fVar4 == fVar2 < 0.0) {
    fVar4 = -fVar4;
  }
  pVVar3->f32 = fVar4;
  return;
}

Assistant:

INTERP (Copysign_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = ((z2 < 0) != (z1 < 0)) ? -z1 : z1;
}